

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserMhapTest_FormatError_Test::BioparserMhapTest_FormatError_Test
          (BioparserMhapTest_FormatError_Test *this)

{
  BioparserMhapTest::BioparserMhapTest(&this->super_BioparserMhapTest);
  (this->super_BioparserMhapTest).super_Test._vptr_Test =
       (_func_int **)&PTR__BioparserMhapTest_0014f410;
  return;
}

Assistant:

TEST_F(BioparserMhapTest, FormatError) {
  Setup("sample.paf");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::MhapParser] error: invalid file format");
  }
}